

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_lsrk_varjac.c
# Opt level: O0

int dom_eig(sunrealtype t,N_Vector y,N_Vector fn,sunrealtype *lambdaR,sunrealtype *lambdaI,
           void *user_data,N_Vector temp1,N_Vector temp2,N_Vector temp3)

{
  double dVar1;
  double dVar2;
  undefined8 *in_RCX;
  double *in_RDX;
  double *in_R8;
  double in_XMM0_Qa;
  double dVar3;
  sunrealtype alpha;
  sunrealtype lambda;
  sunrealtype *rdata;
  
  dVar1 = *in_R8;
  dVar2 = in_R8[1];
  dVar3 = acos(-1.0);
  dVar3 = cos(((10.0 - in_XMM0_Qa) / 10.0) * dVar3);
  *in_RDX = -dVar2 * dVar3 + dVar1;
  *in_RCX = 0;
  return 0;
}

Assistant:

static int dom_eig(sunrealtype t, N_Vector y, N_Vector fn, sunrealtype* lambdaR,
                   sunrealtype* lambdaI, void* user_data, N_Vector temp1,
                   N_Vector temp2, N_Vector temp3)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype lambda = rdata[0]; /* set shortcut for stiffness parameter 1 */
  sunrealtype alpha  = rdata[1]; /* set shortcut for stiffness parameter 2 */
  *lambdaR =
    (lambda -
     alpha * COS((SUN_RCONST(10.0) - t) / SUN_RCONST(10.0) *
                 ACOS(SUN_RCONST(-1.0)))); /* access current solution value */
  *lambdaI = SUN_RCONST(0.0);

  return 0; /* return with success */
}